

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O2

wchar_t path_excluded(archive_match *a,wchar_t mbs,void *pathname)

{
  match_list *pmVar1;
  wchar_t *pwVar2;
  wchar_t wVar3;
  int *in_RCX;
  undefined4 in_register_00000034;
  bool bVar4;
  match *pmVar5;
  char *local_38;
  
  if (a == (archive_match *)0x0) {
    return L'\0';
  }
  pmVar1 = &a->inclusions;
  bVar4 = true;
  pmVar5 = (match *)pmVar1;
  while (pmVar5 = pmVar5->next, pmVar5 != (match *)0x0) {
    if (pmVar5->matches == 0) {
      wVar3 = match_path_inclusion(a,pmVar5,mbs,in_RCX);
      if (wVar3 != L'\0') {
        if (wVar3 < L'\0') {
          return wVar3;
        }
        pwVar2 = &(a->inclusions).unmatched_count;
        *pwVar2 = *pwVar2 + L'\xffffffff';
        pmVar5->matches = pmVar5->matches + 1;
        bVar4 = false;
      }
    }
  }
  pmVar5 = (match *)&a->exclusions;
  while (pmVar5 = pmVar5->next, pmVar5 != (match *)0x0) {
    wVar3 = archive_mstring_get_mbs(&a->archive,&pmVar5->pattern,&local_38);
    if (wVar3 == L'\0') {
      wVar3 = __archive_pathmatch(local_38,(char *)CONCAT44(in_register_00000034,mbs),L'\x03');
    }
    else {
      in_RCX = __errno_location();
      wVar3 = L'\0';
      if (*in_RCX == 0xc) {
        error_nomem(a);
        return L'\xffffffe2';
      }
    }
    if (wVar3 != L'\0') {
      return wVar3;
    }
  }
  pmVar5 = (match *)pmVar1;
  if (bVar4) {
    do {
      do {
        pmVar5 = pmVar5->next;
        if (pmVar5 == (match *)0x0) {
          return (uint)(pmVar1->first != (match *)0x0);
        }
      } while (pmVar5->matches < 1);
      wVar3 = match_path_inclusion(a,pmVar5,mbs,in_RCX);
    } while (wVar3 == L'\0');
    if (wVar3 < L'\0') {
      return wVar3;
    }
    pmVar5->matches = pmVar5->matches + 1;
  }
  return L'\0';
}

Assistant:

static int
path_excluded(struct archive_match *a, int mbs, const void *pathname)
{
	struct match *match;
	struct match *matched;
	int r;

	if (a == NULL)
		return (0);

	/* Mark off any unmatched inclusions. */
	/* In particular, if a filename does appear in the archive and
	 * is explicitly included and excluded, then we don't report
	 * it as missing even though we don't extract it.
	 */
	matched = NULL;
	for (match = a->inclusions.first; match != NULL;
	    match = match->next){
		if (match->matches == 0 &&
		    (r = match_path_inclusion(a, match, mbs, pathname)) != 0) {
			if (r < 0)
				return (r);
			a->inclusions.unmatched_count--;
			match->matches++;
			matched = match;
		}
	}

	/* Exclusions take priority */
	for (match = a->exclusions.first; match != NULL;
	    match = match->next){
		r = match_path_exclusion(a, match, mbs, pathname);
		if (r)
			return (r);
	}

	/* It's not excluded and we found an inclusion above, so it's
	 * included. */
	if (matched != NULL)
		return (0);


	/* We didn't find an unmatched inclusion, check the remaining ones. */
	for (match = a->inclusions.first; match != NULL;
	    match = match->next){
		/* We looked at previously-unmatched inclusions already. */
		if (match->matches > 0 &&
		    (r = match_path_inclusion(a, match, mbs, pathname)) != 0) {
			if (r < 0)
				return (r);
			match->matches++;
			return (0);
		}
	}

	/* If there were inclusions, default is to exclude. */
	if (a->inclusions.first != NULL)
	    return (1);

	/* No explicit inclusions, default is to match. */
	return (0);
}